

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Bool XML_ParserReset(XML_Parser parser,XML_Char *encodingName)

{
  tag *ptVar1;
  open_internal_entity *poVar2;
  DTD *table;
  XML_Bool XVar3;
  OPEN_INTERNAL_ENTITY *openEntity;
  OPEN_INTERNAL_ENTITY *pOVar4;
  NAMED *pNVar5;
  TAG *tag;
  TAG *pTVar6;
  HASH_TABLE_ITER local_38;
  
  if (parser != (XML_Parser)0x0) {
    if (parser->m_parentParser == (XML_Parser)0x0) {
      pTVar6 = parser->m_tagStack;
      while (pTVar6 != (TAG *)0x0) {
        ptVar1 = pTVar6->parent;
        pTVar6->parent = parser->m_freeTagList;
        moveToFreeBindingList(parser,pTVar6->bindings);
        pTVar6->bindings = (BINDING *)0x0;
        parser->m_freeTagList = pTVar6;
        pTVar6 = ptVar1;
      }
      pOVar4 = parser->m_openInternalEntities;
      while (pOVar4 != (OPEN_INTERNAL_ENTITY *)0x0) {
        poVar2 = pOVar4->next;
        pOVar4->next = parser->m_freeInternalEntities;
        parser->m_freeInternalEntities = pOVar4;
        pOVar4 = poVar2;
      }
      moveToFreeBindingList(parser,parser->m_inheritedBindings);
      (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
      if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
        (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
      }
      poolClear(&parser->m_tempPool);
      poolClear(&parser->m_temp2Pool);
      (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
      parser->m_protocolEncodingName = (XML_Char *)0x0;
      parserInit(parser,encodingName);
      table = parser->m_dtd;
      local_38.p = (table->elementTypes).v;
      local_38.end = local_38.p + (table->elementTypes).size;
      while( true ) {
        pNVar5 = hashTableIterNext(&local_38);
        if (pNVar5 == (NAMED *)0x0) break;
        if (*(int *)((long)&pNVar5[3].name + 4) != 0) {
          (*(parser->m_mem).free_fcn)(pNVar5[4].name);
        }
      }
      hashTableClear(&table->generalEntities);
      hashTableClear(&table->elementTypes);
      hashTableClear(&table->attributeIds);
      hashTableClear(&table->prefixes);
      poolClear(&table->pool);
      poolClear(&table->entityValuePool);
      table->in_eldecl = '\0';
      (table->defaultPrefix).name = (XML_Char *)0x0;
      (table->defaultPrefix).binding = (BINDING *)0x0;
      (*(parser->m_mem).free_fcn)(table->scaffIndex);
      table->scaffIndex = (int *)0x0;
      (*(parser->m_mem).free_fcn)(table->scaffold);
      table->scaffCount = 0;
      table->scaffLevel = 0;
      table->scaffold = (CONTENT_SCAFFOLD *)0x0;
      table->contentStringLen = 0;
      table->scaffSize = 0;
      table->keepProcessing = '\x01';
      table->hasParamEntityRefs = '\0';
      table->standalone = '\0';
      XVar3 = '\x01';
    }
    else {
      XVar3 = '\0';
    }
    return XVar3;
  }
  return '\0';
}

Assistant:

XML_Bool XMLCALL
XML_ParserReset(XML_Parser parser, const XML_Char *encodingName)
{
  TAG *tStk;
  OPEN_INTERNAL_ENTITY *openEntityList;

  if (parser == NULL)
      return XML_FALSE;

  if (parser->m_parentParser)
    return XML_FALSE;
  /* move m_tagStack to m_freeTagList */
  tStk = parser->m_tagStack;
  while (tStk) {
    TAG *tag = tStk;
    tStk = tStk->parent;
    tag->parent = parser->m_freeTagList;
    moveToFreeBindingList(parser, tag->bindings);
    tag->bindings = NULL;
    parser->m_freeTagList = tag;
  }
  /* move m_openInternalEntities to m_freeInternalEntities */
  openEntityList = parser->m_openInternalEntities;
  while (openEntityList) {
    OPEN_INTERNAL_ENTITY *openEntity = openEntityList;
    openEntityList = openEntity->next;
    openEntity->next = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity;
  }
  moveToFreeBindingList(parser, parser->m_inheritedBindings);
  FREE(parser, parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease)
    parser->m_unknownEncodingRelease(parser->m_unknownEncodingData);
  poolClear(&parser->m_tempPool);
  poolClear(&parser->m_temp2Pool);
  FREE(parser, (void *)parser->m_protocolEncodingName);
  parser->m_protocolEncodingName = NULL;
  parserInit(parser, encodingName);
  dtdReset(parser->m_dtd, &parser->m_mem);
  return XML_TRUE;
}